

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info_base.hpp
# Opt level: O3

void * asio::detail::thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                 (long *param_1,long param_2,ulong param_3)

{
  ulong uVar1;
  bool bVar2;
  void *pointer;
  void *pvVar3;
  byte *pbVar4;
  bool bVar5;
  long lVar6;
  byte bVar7;
  
  uVar1 = param_2 + 3;
  if (param_1 != (long *)0x0) {
    lVar6 = 0;
    bVar2 = true;
    do {
      bVar5 = bVar2;
      pbVar4 = (byte *)param_1[lVar6];
      if (((pbVar4 != (byte *)0x0) && (uVar1 >> 2 <= (ulong)*pbVar4)) &&
         ((ulong)pbVar4 % param_3 == 0)) {
        param_1[lVar6] = 0;
        bVar7 = *pbVar4;
        goto LAB_00117c5c;
      }
      lVar6 = 1;
      bVar2 = false;
    } while (bVar5);
    pvVar3 = (void *)*param_1;
    if (pvVar3 == (void *)0x0) {
      pvVar3 = (void *)param_1[1];
      lVar6 = 1;
      if (pvVar3 == (void *)0x0) goto LAB_00117c3d;
    }
    else {
      lVar6 = 0;
    }
    param_1[lVar6] = 0;
    operator_delete(pvVar3);
  }
LAB_00117c3d:
  pbVar4 = (byte *)operator_new((uVar1 & 0xfffffffffffffffc) + 1);
  bVar7 = (byte)(uVar1 >> 2);
  if (0x3ff < uVar1) {
    bVar7 = 0;
  }
LAB_00117c5c:
  pbVar4[param_2] = bVar7;
  return pbVar4;
}

Assistant:

static void* allocate(Purpose, thread_info_base* this_thread,
      std::size_t size, std::size_t align = ASIO_DEFAULT_ALIGN)
  {
    std::size_t chunks = (size + chunk_size - 1) / chunk_size;

    if (this_thread)
    {
      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          unsigned char* const mem = static_cast<unsigned char*>(pointer);
          if (static_cast<std::size_t>(mem[0]) >= chunks
              && reinterpret_cast<std::size_t>(pointer) % align == 0)
          {
            this_thread->reusable_memory_[mem_index] = 0;
            mem[size] = mem[0];
            return pointer;
          }
        }
      }

      for (int mem_index = Purpose::begin_mem_index;
          mem_index < Purpose::end_mem_index; ++mem_index)
      {
        if (this_thread->reusable_memory_[mem_index])
        {
          void* const pointer = this_thread->reusable_memory_[mem_index];
          this_thread->reusable_memory_[mem_index] = 0;
          aligned_delete(pointer);
          break;
        }
      }
    }

    void* const pointer = aligned_new(align, chunks * chunk_size + 1);
    unsigned char* const mem = static_cast<unsigned char*>(pointer);
    mem[size] = (chunks <= UCHAR_MAX) ? static_cast<unsigned char>(chunks) : 0;
    return pointer;
  }